

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

bool UTF_U_to_u8<(char)63>(UTF_US32 *us32,UTF_US8 *us8)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  uchar __c;
  long lVar4;
  UTF_UC8 uc8 [4];
  uchar local_2c;
  uchar local_2b;
  uchar local_2a;
  uchar local_29;
  
  pcVar1 = (us32->_M_dataplus)._M_p;
  sVar2 = us32->_M_string_length;
  lVar4 = 0;
  do {
    if (sVar2 << 2 == lVar4) {
      return true;
    }
    bVar3 = UTF_uc32_to_uc8(*(UTF_UC32 *)((long)pcVar1 + lVar4),&local_2c);
    __c = '?';
    if (bVar3) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(us8,local_2c);
      if (local_2b != '\0') {
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(us8,local_2b);
        if (local_2a != '\0') {
          std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::push_back(us8,local_2a);
          __c = local_29;
          if (local_29 != '\0') goto LAB_00103673;
        }
      }
    }
    else {
LAB_00103673:
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(us8,__c);
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

inline bool
UTF_U_to_u8(const UTF_US32& us32, UTF_US8& us8)
{
    UTF_UC8 uc8[4];
    UTF_US32::const_iterator it, end = us32.end();
    for (it = us32.begin(); it != end; ++it)
    {
        if (!UTF_uc32_to_uc8(*it, uc8))
        {
            if (!t_default_char)
                return false;

            us8.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us8.push_back(uc8[0]);
        if (uc8[1])
        {
            us8.push_back(uc8[1]);
            if (uc8[2])
            {
                us8.push_back(uc8[2]);
                if (uc8[3])
                {
                    us8.push_back(uc8[3]);
                }
            }
        }
    }

    return true;
}